

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_53::IntDigits::PrintAsOct<unsigned_long>
          (IntDigits *this,unsigned_long v)

{
  char *pcVar1;
  char *local_20;
  char *p;
  unsigned_long v_local;
  IntDigits *this_local;
  
  local_20 = &this->field_0x3c;
  p = (char *)v;
  do {
    pcVar1 = local_20 + -1;
    local_20[-1] = ((byte)p & 7) + 0x30;
    p = (char *)((ulong)p >> 3);
    local_20 = pcVar1;
  } while (p != (char *)0x0);
  this->start_ = pcVar1;
  this->size_ = (long)this + (0x3c - (long)pcVar1);
  return;
}

Assistant:

void PrintAsOct(T v) {
    static_assert(!IsSigned<T>::value, "");
    char *p = storage_ + sizeof(storage_);
    do {
      *--p = static_cast<char>('0' + (static_cast<size_t>(v) & 7));
      v >>= 3;
    } while (v);
    start_ = p;
    size_ = static_cast<size_t>(storage_ + sizeof(storage_) - p);
  }